

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.H
# Opt level: O0

void __thiscall
Fl_Window::size_range(Fl_Window *this,int minw,int minh,int maxw,int maxh,int dw,int dh,int aspect)

{
  int dw_local;
  int maxh_local;
  int maxw_local;
  int minh_local;
  int minw_local;
  Fl_Window *this_local;
  
  this->minw = minw;
  this->minh = minh;
  this->maxw = maxw;
  this->maxh = maxh;
  this->dw = dw;
  this->dh = dh;
  this->aspect = aspect;
  size_range_(this);
  return;
}

Assistant:

void size_range(int minw, int minh, int maxw=0, int maxh=0, int dw=0, int dh=0, int aspect=0) {
    this->minw   = minw;
    this->minh   = minh;
    this->maxw   = maxw;
    this->maxh   = maxh;
    this->dw     = dw;
    this->dh     = dh;
    this->aspect = aspect;
    size_range_();
  }